

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_3DM_BIG_CHUNK>::Append(ON_SimpleArray<ON_3DM_BIG_CHUNK> *this,ON_3DM_BIG_CHUNK *x)

{
  ON__UINT64 OVar1;
  ON__UINT64 OVar2;
  undefined8 uVar3;
  ON_3DM_BIG_CHUNK *pOVar4;
  ON__UINT8 OVar5;
  ON__UINT16 OVar6;
  ON__UINT32 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  ON__UINT8 OVar10;
  uint uVar11;
  ON_3DM_BIG_CHUNK *pOVar12;
  ON_3DM_BIG_CHUNK *pOVar13;
  uint uVar14;
  
  uVar11 = this->m_count;
  pOVar12 = x;
  if (uVar11 == this->m_capacity) {
    if (((int)uVar11 < 8) || ((ulong)((long)(int)uVar11 * 0x28) < 0x10000001)) {
      uVar14 = 4;
      if (2 < (int)uVar11) {
        uVar14 = uVar11 * 2;
      }
    }
    else {
      uVar14 = 0x66666e;
      if (uVar11 < 0x66666e) {
        uVar14 = uVar11;
      }
      uVar14 = uVar14 + uVar11;
    }
    if (x < this->m_a + (int)uVar11 && this->m_a <= x) {
      pOVar12 = (ON_3DM_BIG_CHUNK *)onmalloc(0x28);
      OVar5 = x->m_do_crc32;
      OVar6 = x->m_crc16;
      OVar7 = x->m_crc32;
      pOVar12->m_do_crc16 = x->m_do_crc16;
      pOVar12->m_do_crc32 = OVar5;
      pOVar12->m_crc16 = OVar6;
      pOVar12->m_crc32 = OVar7;
      OVar1 = x->m_start_offset;
      OVar2 = x->m_end_offset;
      OVar7 = x->m_typecode;
      OVar5 = x->m_bLongChunk;
      OVar8 = x->m_reserved1;
      OVar9 = x->m_reserved2;
      OVar10 = x->m_reserved3;
      pOVar12->m_big_value = x->m_big_value;
      pOVar12->m_typecode = OVar7;
      pOVar12->m_bLongChunk = OVar5;
      pOVar12->m_reserved1 = OVar8;
      pOVar12->m_reserved2 = OVar9;
      pOVar12->m_reserved3 = OVar10;
      pOVar12->m_start_offset = OVar1;
      pOVar12->m_end_offset = OVar2;
      uVar11 = this->m_capacity;
    }
    if (uVar11 < uVar14) {
      SetCapacity(this,(long)(int)uVar14);
    }
    pOVar13 = this->m_a;
    if (pOVar13 == (ON_3DM_BIG_CHUNK *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar11 = this->m_count;
  }
  else {
    pOVar13 = this->m_a;
  }
  this->m_count = uVar11 + 1;
  OVar5 = pOVar12->m_do_crc32;
  OVar6 = pOVar12->m_crc16;
  OVar7 = pOVar12->m_crc32;
  pOVar4 = pOVar13 + (int)uVar11;
  pOVar4->m_do_crc16 = pOVar12->m_do_crc16;
  pOVar4->m_do_crc32 = OVar5;
  pOVar4->m_crc16 = OVar6;
  pOVar4->m_crc32 = OVar7;
  OVar1 = pOVar12->m_start_offset;
  OVar2 = pOVar12->m_end_offset;
  uVar3 = *(undefined8 *)&pOVar12->m_typecode;
  pOVar13[(int)uVar11].m_big_value = pOVar12->m_big_value;
  (&pOVar13[(int)uVar11].m_big_value)[1] = uVar3;
  pOVar13[(int)uVar11].m_start_offset = OVar1;
  pOVar13[(int)uVar11].m_end_offset = OVar2;
  if (pOVar12 != x) {
    onfree(pOVar12);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}